

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O0

void __thiscall CDBBatch::CDBBatch(CDBBatch *this,CDBWrapper *_parent)

{
  long lVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  DataStream *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  std::make_unique<CDBBatch::WriteBatchImpl>();
  this_00 = (DataStream *)0x0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  DataStream::DataStream((DataStream *)0x0);
  in_RDI[8] = this_00;
  in_RDI[9] = 0;
  in_RDI[6] = this_00;
  in_RDI[7] = 0;
  DataStream::DataStream(this_00);
  in_RDI[10] = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBBatch::CDBBatch(const CDBWrapper& _parent)
    : parent{_parent},
      m_impl_batch{std::make_unique<CDBBatch::WriteBatchImpl>()} {}